

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

int * __thiscall
google::protobuf::internal::ExtensionSet::GetRefEnum
          (ExtensionSet *this,int number,int *default_value)

{
  Extension *pEVar1;
  Nonnull<const_char_*> pcVar2;
  undefined1 *v1;
  undefined1 local_20 [16];
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    return default_value;
  }
  if ((pEVar1->field_0xa & 2) != 0) {
    return default_value;
  }
  if (pEVar1->is_repeated == false) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (pcVar2 != (Nonnull<const_char_*>)0x0) {
    GetRefEnum();
    goto LAB_00286ea0;
  }
  if ((byte)(pEVar1->type - 0x13) < 0xee) {
    v1 = local_20;
    GetRefEnum();
LAB_00286e80:
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)v1,8,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
  }
  else {
    v1 = (undefined1 *)
         (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4);
    if (v1 != (undefined1 *)0x8) goto LAB_00286e80;
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    return (int *)pEVar1;
  }
LAB_00286ea0:
  GetRefEnum();
}

Assistant:

const int& ExtensionSet::GetRefEnum(int number,
                                    const int& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}